

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  long lVar33;
  ushort uVar34;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  undefined1 auVar35 [14];
  undefined1 auVar36 [11];
  byte bVar42;
  short sVar43;
  ushort uVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  undefined1 auVar44 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  short sVar61;
  short sVar62;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar63 [16];
  undefined1 auVar71 [16];
  short sVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  auVar31 = _DAT_001a8770;
  auVar30 = _DAT_001a8710;
  lVar32 = 0;
  lVar33 = 0;
  while (lVar33 + 4 <= (long)num_pixels) {
    auVar80 = *(undefined1 (*) [16])((long)in + lVar32 + -4);
    pcVar1 = (char *)((long)in + lVar32);
    cVar11 = pcVar1[1];
    cVar12 = pcVar1[2];
    cVar13 = pcVar1[3];
    cVar14 = pcVar1[4];
    cVar15 = pcVar1[5];
    cVar16 = pcVar1[6];
    cVar17 = pcVar1[7];
    cVar18 = pcVar1[8];
    cVar19 = pcVar1[9];
    cVar20 = pcVar1[10];
    cVar21 = pcVar1[0xb];
    cVar22 = pcVar1[0xc];
    cVar23 = pcVar1[0xd];
    cVar24 = pcVar1[0xe];
    cVar25 = pcVar1[0xf];
    auVar3 = *(undefined1 (*) [16])((long)upper + lVar32 + -4);
    auVar52 = *(undefined1 (*) [16])((long)upper + lVar32);
    auVar79 = auVar52 & auVar80;
    auVar35 = auVar52._2_14_ ^ auVar80._2_14_;
    auVar70._0_14_ = auVar80._0_14_;
    auVar70[0xe] = auVar80[7];
    auVar70[0xf] = auVar80[7];
    auVar69._14_2_ = auVar70._14_2_;
    auVar69._0_13_ = auVar80._0_13_;
    auVar69[0xd] = auVar80[6];
    auVar68._13_3_ = auVar69._13_3_;
    auVar68._0_12_ = auVar80._0_12_;
    auVar68[0xc] = auVar80[6];
    auVar67._12_4_ = auVar68._12_4_;
    auVar67._0_11_ = auVar80._0_11_;
    auVar67[0xb] = auVar80[5];
    auVar66._11_5_ = auVar67._11_5_;
    auVar66._0_10_ = auVar80._0_10_;
    auVar66[10] = auVar80[5];
    auVar65._10_6_ = auVar66._10_6_;
    auVar65._0_9_ = auVar80._0_9_;
    auVar65[9] = auVar80[4];
    auVar64._9_7_ = auVar65._9_7_;
    auVar64._0_8_ = auVar80._0_8_;
    auVar64[8] = auVar80[4];
    auVar63._8_8_ = auVar64._8_8_;
    auVar63[7] = auVar80[3];
    auVar63[6] = auVar80[3];
    auVar63[5] = auVar80[2];
    auVar63[4] = auVar80[2];
    auVar63[3] = auVar80[1];
    auVar63[2] = auVar80[1];
    auVar63[0] = auVar80[0];
    auVar63[1] = auVar63[0];
    auVar50._0_14_ = auVar52._0_14_;
    auVar50[0xe] = auVar52[7];
    auVar50[0xf] = auVar52[7];
    auVar49._14_2_ = auVar50._14_2_;
    auVar49._0_13_ = auVar52._0_13_;
    auVar49[0xd] = auVar52[6];
    auVar48._13_3_ = auVar49._13_3_;
    auVar48._0_12_ = auVar52._0_12_;
    auVar48[0xc] = auVar52[6];
    auVar47._12_4_ = auVar48._12_4_;
    auVar47._0_11_ = auVar52._0_11_;
    auVar47[0xb] = auVar52[5];
    auVar46._11_5_ = auVar47._11_5_;
    auVar46._0_10_ = auVar52._0_10_;
    auVar46[10] = auVar52[5];
    auVar45._10_6_ = auVar46._10_6_;
    auVar45._0_9_ = auVar52._0_9_;
    auVar45[9] = auVar52[4];
    auVar44._9_7_ = auVar45._9_7_;
    auVar44._0_8_ = auVar52._0_8_;
    auVar44[8] = auVar52[4];
    auVar51._8_8_ = auVar44._8_8_;
    auVar51[7] = auVar52[3];
    auVar51[6] = auVar52[3];
    auVar51[5] = auVar52[2];
    auVar51[4] = auVar52[2];
    auVar51[3] = auVar52[1];
    auVar51[2] = auVar52[1];
    auVar51[0] = auVar52[0];
    auVar51[1] = auVar51[0];
    auVar4[0xd] = 0;
    auVar4._0_13_ = auVar3._0_13_;
    auVar4[0xe] = auVar3[7];
    auVar5[0xc] = auVar3[6];
    auVar5._0_12_ = auVar3._0_12_;
    auVar5._13_2_ = auVar4._13_2_;
    auVar6[0xb] = 0;
    auVar6._0_11_ = auVar3._0_11_;
    auVar6._12_3_ = auVar5._12_3_;
    auVar7[10] = auVar3[5];
    auVar7._0_10_ = auVar3._0_10_;
    auVar7._11_4_ = auVar6._11_4_;
    auVar8[9] = 0;
    auVar8._0_9_ = auVar3._0_9_;
    auVar8._10_5_ = auVar7._10_5_;
    auVar9[8] = auVar3[4];
    auVar9._0_8_ = auVar3._0_8_;
    auVar9._9_6_ = auVar8._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar9._8_7_;
    Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),auVar3[3]);
    auVar28._9_6_ = 0;
    auVar28._0_9_ = Var27;
    auVar36._1_10_ = SUB1510(auVar28 << 0x30,5);
    auVar36[0] = auVar3[2];
    auVar29._11_4_ = 0;
    auVar29._0_11_ = auVar36;
    auVar10[2] = auVar3[1];
    auVar10._0_2_ = auVar3._0_2_;
    auVar10._3_12_ = SUB1512(auVar29 << 0x20,3);
    uVar54 = auVar3._0_2_ & 0xff;
    auVar80 = auVar51 & auVar63;
    auVar51 = auVar51 ^ auVar63;
    auVar52._0_2_ = auVar51._0_2_ >> 1;
    auVar52._2_2_ = auVar51._2_2_ >> 1;
    auVar52._4_2_ = auVar51._4_2_ >> 1;
    auVar52._6_2_ = auVar51._6_2_ >> 1;
    auVar52._8_2_ = auVar51._8_2_ >> 1;
    auVar52._10_2_ = auVar51._10_2_ >> 1;
    auVar52._12_2_ = auVar51._12_2_ >> 1;
    auVar52._14_2_ = auVar51._14_2_ >> 1;
    auVar52 = auVar52 & auVar30;
    auVar53[0] = auVar52[0] + auVar80[0];
    auVar53[1] = auVar52[1] + auVar80[1];
    auVar53[2] = auVar52[2] + auVar80[2];
    auVar53[3] = auVar52[3] + auVar80[3];
    auVar53[4] = auVar52[4] + auVar80[4];
    auVar53[5] = auVar52[5] + auVar80[5];
    auVar53[6] = auVar52[6] + auVar80[6];
    auVar53[7] = auVar52[7] + auVar80[7];
    auVar53[8] = auVar52[8] + auVar80[8];
    auVar53[9] = auVar52[9] + auVar80[9];
    auVar53[10] = auVar52[10] + auVar80[10];
    auVar53[0xb] = auVar52[0xb] + auVar80[0xb];
    auVar53[0xc] = auVar52[0xc] + auVar80[0xc];
    auVar53[0xd] = auVar52[0xd] + auVar80[0xd];
    auVar53[0xe] = auVar52[0xe] + auVar80[0xe];
    auVar53[0xf] = auVar52[0xf] + auVar80[0xf];
    auVar53 = auVar53 & auVar31;
    sVar62 = auVar53._0_2_;
    sVar72 = auVar53._2_2_;
    sVar73 = auVar53._4_2_;
    sVar74 = auVar53._6_2_;
    sVar43 = (short)Var27;
    sVar75 = auVar53._8_2_;
    sVar76 = auVar53._10_2_;
    sVar77 = auVar53._12_2_;
    sVar78 = auVar53._14_2_;
    uVar34 = auVar4._13_2_ >> 8;
    auVar71._0_2_ = (sVar62 - uVar54) + (ushort)(sVar62 < (short)uVar54);
    auVar71._2_2_ = (sVar72 - auVar10._2_2_) + (ushort)(sVar72 < auVar10._2_2_);
    auVar71._4_2_ = (sVar73 - auVar36._0_2_) + (ushort)(sVar73 < auVar36._0_2_);
    auVar71._6_2_ = (sVar74 - sVar43) + (ushort)(sVar74 < sVar43);
    auVar71._8_2_ = (sVar75 - auVar9._8_2_) + (ushort)(sVar75 < auVar9._8_2_);
    auVar71._10_2_ = (sVar76 - auVar7._10_2_) + (ushort)(sVar76 < auVar7._10_2_);
    auVar71._12_2_ = (sVar77 - auVar5._12_2_) + (ushort)(sVar77 < auVar5._12_2_);
    auVar71._14_2_ = (sVar78 - uVar34) + (ushort)(sVar78 < (short)uVar34);
    auVar80 = psraw(auVar71,1);
    sVar62 = auVar80._0_2_ + sVar62;
    sVar72 = auVar80._2_2_ + sVar72;
    sVar73 = auVar80._4_2_ + sVar73;
    sVar74 = auVar80._6_2_ + sVar74;
    sVar75 = auVar80._8_2_ + sVar75;
    sVar76 = auVar80._10_2_ + sVar76;
    sVar77 = auVar80._12_2_ + sVar77;
    sVar78 = auVar80._14_2_ + sVar78;
    auVar80._2_2_ = auVar35._8_2_ >> 1;
    auVar80._0_2_ = auVar35._6_2_ >> 1;
    auVar80._4_2_ = auVar35._10_2_ >> 1;
    auVar80._6_2_ = auVar35._12_2_ >> 1;
    auVar80._8_8_ = 0;
    auVar36 = SUB1611(auVar80 << 0x40,5) & auVar30._5_11_;
    bVar37 = auVar36[5] + auVar79[10];
    bVar38 = auVar36[6] + auVar79[0xb];
    bVar39 = auVar36[7] + auVar79[0xc];
    bVar40 = auVar36[8] + auVar79[0xd];
    bVar41 = auVar36[9] + auVar79[0xe];
    bVar42 = auVar36[10] + auVar79[0xf];
    uVar34 = (ushort)(byte)(auVar36[3] + auVar79[8]);
    uVar54 = (ushort)(byte)(auVar36[4] + auVar79[9]);
    auVar79._0_2_ = (uVar34 - auVar3[8]) + (ushort)(uVar34 < auVar3[8]);
    auVar79._2_2_ = (uVar54 - auVar3[9]) + (ushort)(uVar54 < auVar3[9]);
    auVar79._4_2_ =
         ((ushort)bVar37 - (ushort)auVar3[10]) + (ushort)((ushort)bVar37 < (ushort)auVar3[10]);
    auVar79._6_2_ =
         ((ushort)bVar38 - (ushort)auVar3[0xb]) + (ushort)((ushort)bVar38 < (ushort)auVar3[0xb]);
    auVar79._8_2_ =
         ((ushort)bVar39 - (ushort)auVar3[0xc]) + (ushort)((ushort)bVar39 < (ushort)auVar3[0xc]);
    auVar79._10_2_ =
         ((ushort)bVar40 - (ushort)auVar3[0xd]) + (ushort)((ushort)bVar40 < (ushort)auVar3[0xd]);
    auVar79._12_2_ =
         ((ushort)bVar41 - (ushort)auVar3[0xe]) + (ushort)((ushort)bVar41 < (ushort)auVar3[0xe]);
    auVar79._14_2_ =
         ((ushort)bVar42 - (ushort)auVar3[0xf]) + (ushort)((ushort)bVar42 < (ushort)auVar3[0xf]);
    auVar80 = psraw(auVar79,1);
    sVar43 = auVar80._0_2_ + uVar34;
    sVar55 = auVar80._2_2_ + uVar54;
    sVar56 = auVar80._4_2_ + (ushort)bVar37;
    sVar57 = auVar80._6_2_ + (ushort)bVar38;
    sVar58 = auVar80._8_2_ + (ushort)bVar39;
    sVar59 = auVar80._10_2_ + (ushort)bVar40;
    sVar60 = auVar80._12_2_ + (ushort)bVar41;
    sVar61 = auVar80._14_2_ + (ushort)bVar42;
    pcVar2 = (char *)((long)out + lVar32);
    *pcVar2 = *pcVar1 - ((0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62));
    pcVar2[1] = cVar11 - ((0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72));
    pcVar2[2] = cVar12 - ((0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73));
    pcVar2[3] = cVar13 - ((0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74));
    pcVar2[4] = cVar14 - ((0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75));
    pcVar2[5] = cVar15 - ((0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76));
    pcVar2[6] = cVar16 - ((0 < sVar77) * (sVar77 < 0x100) * (char)sVar77 - (0xff < sVar77));
    pcVar2[7] = cVar17 - ((0 < sVar78) * (sVar78 < 0x100) * (char)sVar78 - (0xff < sVar78));
    pcVar2[8] = cVar18 - ((0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43));
    pcVar2[9] = cVar19 - ((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55));
    pcVar2[10] = cVar20 - ((0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56));
    pcVar2[0xb] = cVar21 - ((0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57));
    pcVar2[0xc] = cVar22 - ((0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58));
    pcVar2[0xd] = cVar23 - ((0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59));
    pcVar2[0xe] = cVar24 - ((0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60));
    pcVar2[0xf] = cVar25 - ((0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61));
    lVar32 = lVar32 + 0x10;
    lVar33 = lVar33 + 4;
  }
  if (num_pixels == (int)lVar33) {
    return;
  }
  (*VP8LPredictorsSub_C[0xd])
            ((uint32_t *)((long)in + lVar32),(uint32_t *)((long)upper + lVar32),
             num_pixels - (int)lVar33,(uint32_t *)((long)out + lVar32));
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    __m128i A4_lo, A4_hi;
    // lo.
    {
      const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
      const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
      const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
      const __m128i sum_lo = _mm_add_epi16(T_lo, L_lo);
      const __m128i avg_lo = _mm_srli_epi16(sum_lo, 1);
      const __m128i A1_lo = _mm_sub_epi16(avg_lo, TL_lo);
      const __m128i bit_fix_lo = _mm_cmpgt_epi16(TL_lo, avg_lo);
      const __m128i A2_lo = _mm_sub_epi16(A1_lo, bit_fix_lo);
      const __m128i A3_lo = _mm_srai_epi16(A2_lo, 1);
      A4_lo = _mm_add_epi16(avg_lo, A3_lo);
    }
    // hi.
    {
      const __m128i L_hi = _mm_unpackhi_epi8(L, zero);
      const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
      const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
      const __m128i sum_hi = _mm_add_epi16(T_hi, L_hi);
      const __m128i avg_hi = _mm_srli_epi16(sum_hi, 1);
      const __m128i A1_hi = _mm_sub_epi16(avg_hi, TL_hi);
      const __m128i bit_fix_hi = _mm_cmpgt_epi16(TL_hi, avg_hi);
      const __m128i A2_hi = _mm_sub_epi16(A1_hi, bit_fix_hi);
      const __m128i A3_hi = _mm_srai_epi16(A2_hi, 1);
      A4_hi = _mm_add_epi16(avg_hi, A3_hi);
    }
    {
      const __m128i pred = _mm_packus_epi16(A4_lo, A4_hi);
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}